

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_CCtxParam_setMTCtxParameter
                 (ZSTD_CCtx_params *params,ZSTDMT_parameter parameter,int value)

{
  int value_local;
  ZSTDMT_parameter parameter_local;
  ZSTD_CCtx_params *params_local;
  
  if (parameter == ZSTDMT_p_jobSize) {
    params_local = (ZSTD_CCtx_params *)ZSTD_CCtxParams_setParameter(params,ZSTD_c_jobSize,value);
  }
  else if (parameter == ZSTDMT_p_overlapLog) {
    params_local = (ZSTD_CCtx_params *)ZSTD_CCtxParams_setParameter(params,ZSTD_c_overlapLog,value);
  }
  else if (parameter == ZSTDMT_p_rsyncable) {
    params_local = (ZSTD_CCtx_params *)
                   ZSTD_CCtxParams_setParameter(params,ZSTD_c_experimentalParam1,value);
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffd8;
  }
  return (size_t)params_local;
}

Assistant:

size_t
ZSTDMT_CCtxParam_setMTCtxParameter(ZSTD_CCtx_params* params,
                                   ZSTDMT_parameter parameter,
                                   int value)
{
    DEBUGLOG(4, "ZSTDMT_CCtxParam_setMTCtxParameter");
    switch(parameter)
    {
    case ZSTDMT_p_jobSize :
        DEBUGLOG(4, "ZSTDMT_CCtxParam_setMTCtxParameter : set jobSize to %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_jobSize, value);
    case ZSTDMT_p_overlapLog :
        DEBUGLOG(4, "ZSTDMT_p_overlapLog : %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_overlapLog, value);
    case ZSTDMT_p_rsyncable :
        DEBUGLOG(4, "ZSTD_p_rsyncable : %i", value);
        return ZSTD_CCtxParams_setParameter(params, ZSTD_c_rsyncable, value);
    default :
        return ERROR(parameter_unsupported);
    }
}